

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_zTXt(ucvector *out,char *keyword,char *textstring,
                  LodePNGCompressSettings *zlibsettings)

{
  size_t __n;
  long lVar1;
  uchar *chunk_00;
  uint uVar2;
  size_t insize;
  char *orig;
  size_t sVar3;
  size_t compressedsize;
  uchar *compressed;
  uchar *chunk;
  size_t local_38;
  uchar *local_30;
  uchar *local_28;
  
  local_28 = (uchar *)0x0;
  local_30 = (uchar *)0x0;
  local_38 = 0;
  insize = 0xffffffffffffffff;
  do {
    lVar1 = insize + 1;
    insize = insize + 1;
  } while (textstring[lVar1] != '\0');
  __n = 0xffffffffffffffff;
  do {
    sVar3 = __n;
    __n = sVar3 + 1;
  } while (keyword[sVar3 + 1] != '\0');
  uVar2 = 0x59;
  if (0xffffffffffffffb0 < sVar3 - 0x4f) {
    if (zlibsettings->custom_zlib ==
        (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
      uVar2 = lodepng_zlib_compress(&local_30,&local_38,(uchar *)textstring,insize,zlibsettings);
    }
    else {
      uVar2 = (*zlibsettings->custom_zlib)
                        (&local_30,&local_38,(uchar *)textstring,insize,zlibsettings);
    }
    if (uVar2 == 0) {
      uVar2 = lodepng_chunk_init(&local_28,out,(int)local_38 + (int)__n + 2,"zTXt");
      chunk_00 = local_28;
      if (uVar2 == 0) {
        memcpy(local_28 + 8,keyword,__n);
        (chunk_00 + sVar3 + 9)[0] = '\0';
        (chunk_00 + sVar3 + 9)[1] = '\0';
        if (local_38 != 0) {
          memcpy(chunk_00 + sVar3 + 0xb,local_30,local_38);
        }
        lodepng_chunk_generate_crc(chunk_00);
        uVar2 = 0;
      }
    }
    free(local_30);
  }
  return uVar2;
}

Assistant:

static unsigned addChunk_zTXt(ucvector* out, const char* keyword, const char* textstring,
                              LodePNGCompressSettings* zlibsettings) {
  unsigned error = 0;
  unsigned char* chunk = 0;
  unsigned char* compressed = 0;
  size_t compressedsize = 0;
  size_t textsize = lodepng_strlen(textstring);
  size_t keysize = lodepng_strlen(keyword);
  if(keysize < 1 || keysize > 79) return 89; /*error: invalid keyword size*/

  error = zlib_compress(&compressed, &compressedsize,
                        (const unsigned char*)textstring, textsize, zlibsettings);
  if(!error) {
    size_t size = keysize + 2 + compressedsize;
    error = lodepng_chunk_init(&chunk, out, size, "zTXt");
  }
  if(!error) {
    lodepng_memcpy(chunk + 8, keyword, keysize);
    chunk[8 + keysize] = 0; /*null termination char*/
    chunk[9 + keysize] = 0; /*compression method: 0*/
    lodepng_memcpy(chunk + 10 + keysize, compressed, compressedsize);
    lodepng_chunk_generate_crc(chunk);
  }

  lodepng_free(compressed);
  return error;
}